

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_under_debugger_(void)

{
  int __fd;
  ssize_t sVar1;
  char *pcVar2;
  ssize_t n;
  char *field;
  ulong uStack_220;
  pid_t tracer_pid;
  size_t n_read;
  char buf [512];
  int fd;
  
  field._4_4_ = 0;
  n_read = CONCAT71(n_read._1_7_,10);
  uStack_220 = 1;
  __fd = open("/proc/self/status",0);
  if (__fd != -1) {
    while( true ) {
      while ((uStack_220 < 0x1ff &&
             (sVar1 = read(__fd,buf + (uStack_220 - 8),0x1ff - uStack_220), 0 < sVar1))) {
        uStack_220 = sVar1 + uStack_220;
      }
      buf[uStack_220 - 8] = '\0';
      pcVar2 = strstr((char *)&n_read,"\nTracerPid:");
      if ((pcVar2 != (char *)0x0) && (pcVar2 < buf + 0x1d8)) break;
      if (uStack_220 != 0x1ff) goto LAB_0010bbba;
      n_read._0_1_ = buf[0x1d7];
      n_read._1_1_ = buf[0x1d8];
      n_read._2_1_ = buf[0x1d9];
      n_read._3_1_ = buf[0x1da];
      n_read._4_1_ = buf[0x1db];
      n_read._5_1_ = buf[0x1dc];
      n_read._6_1_ = buf[0x1dd];
      n_read._7_1_ = buf[0x1de];
      uStack_220 = 0x20;
    }
    field._4_4_ = atoi(pcVar2 + 0xb);
LAB_0010bbba:
    close(__fd);
    if (field._4_4_ != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
acutest_under_debugger_(void)
{
#ifdef ACUTEST_LINUX_
    /* Scan /proc/self/status for line "TracerPid: [PID]". If such line exists
     * and the PID is non-zero, we're being debugged. */
    {
        static const int OVERLAP = 32;
        int fd;
        char buf[512];
        size_t n_read;
        pid_t tracer_pid = 0;

        /* Little trick so that we can treat the 1st line the same as any other
         * and detect line start easily. */
        buf[0] = '\n';
        n_read = 1;

        fd = open("/proc/self/status", O_RDONLY);
        if(fd != -1) {
            while(1) {
                static const char pattern[] = "\nTracerPid:";
                const char* field;

                while(n_read < sizeof(buf) - 1) {
                    ssize_t n;

                    n = read(fd, buf + n_read, sizeof(buf) - 1 - n_read);
                    if(n <= 0)
                        break;
                    n_read += (size_t)n;
                }
                buf[n_read] = '\0';

                field = strstr(buf, pattern);
                if(field != NULL  &&  field < buf + sizeof(buf) - OVERLAP) {
                    tracer_pid = (pid_t) atoi(field + sizeof(pattern) - 1);
                    break;
                }

                if(n_read == sizeof(buf) - 1) {
                    /* Move the tail with the potentially incomplete line we're
                     * be looking for to the beginning of the buffer.
                     * (The OVERLAP must be large enough so the searched line
                     * can fit in completely.) */
                    memmove(buf, buf + sizeof(buf) - 1 - OVERLAP, OVERLAP);
                    n_read = OVERLAP;
                } else {
                    break;
                }
            }

            close(fd);

            if(tracer_pid != 0)
                return 1;
        }
    }
#endif

#ifdef ACUTEST_MACOS_
    /* See https://developer.apple.com/library/archive/qa/qa1361/_index.html */
    {
        int mib[4];
        struct kinfo_proc info;
        size_t size;

        mib[0] = CTL_KERN;
        mib[1] = KERN_PROC;
        mib[2] = KERN_PROC_PID;
        mib[3] = getpid();

        size = sizeof(info);
        info.kp_proc.p_flag = 0;
        sysctl(mib, sizeof(mib) / sizeof(*mib), &info, &size, NULL, 0);

        if(info.kp_proc.p_flag & P_TRACED)
            return 1;
    }
#endif

#ifdef ACUTEST_WIN_
    if(IsDebuggerPresent())
        return 1;
#endif

#ifdef RUNNING_ON_VALGRIND
    /* We treat Valgrind as a debugger of sorts.
     * (Macro RUNNING_ON_VALGRIND is provided by <valgrind.h>, if available.) */
    if(RUNNING_ON_VALGRIND)
        return 1;
#endif

    return 0;
}